

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall GraphBuilder::~GraphBuilder(GraphBuilder *this)

{
  bool bVar1;
  reference ppNVar2;
  reference ppVar3;
  reference ppVar4;
  reference ppVar5;
  long in_RDI;
  pair<const_llvm::Function_*const,_FunctionGraph_*> iterator_1;
  iterator __end1_3;
  iterator __begin1_3;
  unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
  *__range1_3;
  pair<const_llvm::BasicBlock_*const,_BlockGraph_*> iterator;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
  *__range1_2;
  pair<const_llvm::Instruction_*const,_Node_*> llvmAndNode;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  *__range1_1;
  Node *node;
  iterator __end1;
  iterator __begin1;
  unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_> *__range1
  ;
  unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
  *in_stack_ffffffffffffff38;
  BlockGraph *in_stack_ffffffffffffff40;
  _Node_iterator_base<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false> local_90;
  _Node_iterator_base<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false> local_88;
  long local_80;
  BasicBlock *local_78;
  BlockGraph *local_70;
  _Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false> local_68;
  _Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false> local_60;
  long local_58;
  Instruction *local_50;
  Node *local_48;
  _Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false> local_40;
  _Node_iterator_base<std::pair<const_llvm::Instruction_*const,_Node_*>,_false> local_38;
  long local_30;
  Node *local_28;
  _Node_iterator_base<Node_*,_false> local_20;
  _Node_iterator_base<Node_*,_false> local_18;
  long local_10;
  
  local_10 = in_RDI + 8;
  local_18._M_cur =
       (__node_type *)
       std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
       ::begin((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                *)in_stack_ffffffffffffff38);
  local_20._M_cur =
       (__node_type *)
       std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
       ::end((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppNVar2 = std::__detail::_Node_iterator<Node_*,_true,_false>::operator*
                        ((_Node_iterator<Node_*,_true,_false> *)0x19255a);
    local_28 = *ppNVar2;
    if (local_28 != (Node *)0x0) {
      (*local_28->_vptr_Node[1])();
    }
    std::__detail::_Node_iterator<Node_*,_true,_false>::operator++
              ((_Node_iterator<Node_*,_true,_false> *)in_stack_ffffffffffffff40);
  }
  local_30 = in_RDI + 0x40;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
       ::begin((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
                *)in_stack_ffffffffffffff38);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
       ::end((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>
                        *)0x1925f7);
    local_50 = ppVar3->first;
    local_48 = ppVar3->second;
    if (local_48 != (Node *)0x0) {
      (*local_48->_vptr_Node[1])();
    }
    std::__detail::_Node_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false> *)
               in_stack_ffffffffffffff40);
  }
  local_58 = in_RDI + 0x78;
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
       ::begin((unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
                *)in_stack_ffffffffffffff38);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
       ::end((unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false,_false>
                        *)0x192685);
    local_78 = ppVar4->first;
    in_stack_ffffffffffffff40 = ppVar4->second;
    local_70 = in_stack_ffffffffffffff40;
    if (in_stack_ffffffffffffff40 != (BlockGraph *)0x0) {
      operator_delete(in_stack_ffffffffffffff40,0x18);
    }
    std::__detail::
    _Node_iterator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false,_false>
                *)in_stack_ffffffffffffff40);
  }
  local_80 = in_RDI + 0xb0;
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
       ::begin(in_stack_ffffffffffffff38);
  local_90._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
       ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false,_false>
                        *)0x192710);
    if (ppVar5->second != (FunctionGraph *)0x0) {
      operator_delete(ppVar5->second,0x18);
    }
    std::__detail::
    _Node_iterator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>,_false,_false>
                *)in_stack_ffffffffffffff40);
  }
  std::
  unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
                    *)0x19275d);
  std::
  unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
                    *)0x19276e);
  std::
  unordered_map<const_llvm::CallInst_*,_ForkNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_ForkNode_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::CallInst_*,_ForkNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_ForkNode_*>_>_>
                    *)0x19277f);
  std::
  unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
                    *)0x192790);
  std::
  unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
                    *)0x1927a1);
  std::
  unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
                    *)0x1927af);
  std::
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  ::~unordered_map((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
                    *)0x1927bd);
  std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>::
  ~unordered_set((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                  *)0x1927cb);
  return;
}

Assistant:

GraphBuilder::~GraphBuilder() {
    for (auto *node : artificialNodes_) {
        delete node;
    }

    for (auto llvmAndNode : llvmToNodeMap_) {
        delete llvmAndNode.second;
    }

    for (auto iterator : llvmToBlockMap_) {
        delete iterator.second;
    }

    for (auto iterator : llvmToFunctionMap_) {
        delete iterator.second;
    }
}